

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O2

void ed_add_pc(ed *out,ed *P,pced *Q)

{
  fld_t e;
  fld_t a;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t d;
  fld_t c;
  fld_t b;
  limb_t alStack_1a8 [6];
  limb_t local_178 [6];
  limb_t local_148 [6];
  limb_t local_118 [6];
  limb_t local_e8 [6];
  limb_t local_b8 [6];
  limb_t local_88 [6];
  limb_t local_58 [5];
  
  fld_sub(local_178,P->y,P->x);
  fld_mul(local_178,local_178,Q->diff);
  fld_add(local_58,P->y,P->x);
  fld_mul(local_58,local_58,Q->sum);
  fld_mul(local_88,P->t,Q->prod);
  fld_scale2(local_b8,P->z);
  fld_sub(alStack_1a8,local_58,local_178);
  fld_sub(local_e8,local_b8,local_88);
  fld_add(local_118,local_b8,local_88);
  fld_add(local_148,local_58,local_178);
  fld_mul(out->x,alStack_1a8,local_e8);
  fld_mul(out->y,local_118,local_148);
  fld_mul(out->t,alStack_1a8,local_148);
  fld_mul(out->z,local_e8,local_118);
  return;
}

Assistant:

static void
ed_add_pc(struct ed *out, const struct ed *P, const struct pced *Q)
{
	fld_t a, b, c, d, e, f, g, h;

	fld_sub(a, P->y, P->x);
	fld_mul(a, a, Q->diff);

	fld_add(b, P->y, P->x);
	fld_mul(b, b, Q->sum);

	fld_mul(c, P->t, Q->prod);
	fld_scale2(d, P->z);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}